

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O3

uint __thiscall
xercesc_4_0::XMLScanner::resolveQNameWithColon
          (XMLScanner *this,XMLCh *qName,XMLBuffer *prefixBuf,MapModes mode,int prefixColonPos)

{
  uint uVar1;
  XMLCh *prefix;
  
  if (prefixColonPos == -1) {
    prefixBuf->fIndex = 0;
    prefix = L"";
  }
  else {
    prefixBuf->fIndex = 0;
    XMLBuffer::append(prefixBuf,qName,(long)prefixColonPos);
    prefix = prefixBuf->fBuffer;
    prefix[prefixBuf->fIndex] = L'\0';
  }
  uVar1 = resolvePrefix(this,prefix,mode);
  return uVar1;
}

Assistant:

unsigned int
XMLScanner::resolveQNameWithColon(  const XMLCh* const          qName
                                  ,       XMLBuffer&            prefixBuf
                                  , const ElemStack::MapModes   mode
                                  , const int                   prefixColonPos)
{
    //  Lets split out the qName into a URI and name buffer first. The URI
    //  can be empty.
    if (prefixColonPos == -1)
    {
        //  Its all name with no prefix, so put the whole thing into the name
        //  buffer. Then map the empty string to a URI, since the empty string
        //  represents the default namespace. This will either return some
        //  explicit URI which the default namespace is mapped to, or the
        //  the default global namespace.
        prefixBuf.reset();
        return resolvePrefix(XMLUni::fgZeroLenString, mode);
    }
    else
    {
        //  Copy the chars up to but not including the colon into the prefix
        //  buffer.
        prefixBuf.set(qName, prefixColonPos);
        return resolvePrefix(prefixBuf.getRawBuffer(), mode);
    }
}